

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::SetDragDropPayload(char *type,void *data,size_t data_size,ImGuiCond cond)

{
  int iVar1;
  ImGuiContext *pIVar2;
  uchar *puVar3;
  uchar *puVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  size_t size;
  
  pIVar2 = GImGui;
  if ((1 < (uint)cond) && ((GImGui->DragDropPayload).DataFrameCount != -1)) goto LAB_0018f625;
  strncpy((GImGui->DragDropPayload).DataType,type,0x20);
  (pIVar2->DragDropPayload).DataType[0x20] = '\0';
  uVar6 = (pIVar2->DragDropPayloadBufHeap).Capacity;
  if ((int)uVar6 < 0) {
    uVar6 = 0;
    puVar3 = (uchar *)MemAlloc(0);
    puVar4 = (pIVar2->DragDropPayloadBufHeap).Data;
    if (puVar4 != (uchar *)0x0) {
      memcpy(puVar3,puVar4,(long)(pIVar2->DragDropPayloadBufHeap).Size);
      MemFree((pIVar2->DragDropPayloadBufHeap).Data);
    }
    (pIVar2->DragDropPayloadBufHeap).Data = puVar3;
    (pIVar2->DragDropPayloadBufHeap).Capacity = 0;
  }
  (pIVar2->DragDropPayloadBufHeap).Size = 0;
  uVar5 = (uint)data_size;
  if (data_size < 0x11) {
    if (data_size != 0) {
      puVar4 = pIVar2->DragDropPayloadBufLocal;
      pIVar2->DragDropPayloadBufLocal[0] = '\0';
      pIVar2->DragDropPayloadBufLocal[1] = '\0';
      pIVar2->DragDropPayloadBufLocal[2] = '\0';
      pIVar2->DragDropPayloadBufLocal[3] = '\0';
      pIVar2->DragDropPayloadBufLocal[4] = '\0';
      pIVar2->DragDropPayloadBufLocal[5] = '\0';
      pIVar2->DragDropPayloadBufLocal[6] = '\0';
      pIVar2->DragDropPayloadBufLocal[7] = '\0';
      pIVar2->DragDropPayloadBufLocal[8] = '\0';
      pIVar2->DragDropPayloadBufLocal[9] = '\0';
      pIVar2->DragDropPayloadBufLocal[10] = '\0';
      pIVar2->DragDropPayloadBufLocal[0xb] = '\0';
      pIVar2->DragDropPayloadBufLocal[0xc] = '\0';
      pIVar2->DragDropPayloadBufLocal[0xd] = '\0';
      pIVar2->DragDropPayloadBufLocal[0xe] = '\0';
      pIVar2->DragDropPayloadBufLocal[0xf] = '\0';
      (pIVar2->DragDropPayload).Data = puVar4;
      goto LAB_0018f613;
    }
    (pIVar2->DragDropPayload).Data = (void *)0x0;
  }
  else {
    if ((int)uVar6 < (int)uVar5) {
      uVar7 = 8;
      if (uVar6 != 0) {
        uVar7 = (uVar6 >> 1) + uVar6;
      }
      size = (size_t)uVar7;
      if (uVar7 <= uVar5) {
        size = data_size & 0xffffffff;
      }
      puVar4 = (uchar *)MemAlloc(size);
      puVar3 = (pIVar2->DragDropPayloadBufHeap).Data;
      if (puVar3 != (uchar *)0x0) {
        memcpy(puVar4,puVar3,(long)(pIVar2->DragDropPayloadBufHeap).Size);
        MemFree((pIVar2->DragDropPayloadBufHeap).Data);
      }
      (pIVar2->DragDropPayloadBufHeap).Data = puVar4;
      (pIVar2->DragDropPayloadBufHeap).Capacity = (int)size;
    }
    else {
      puVar4 = (pIVar2->DragDropPayloadBufHeap).Data;
    }
    (pIVar2->DragDropPayloadBufHeap).Size = uVar5;
    (pIVar2->DragDropPayload).Data = puVar4;
LAB_0018f613:
    memcpy(puVar4,data,data_size);
  }
  (pIVar2->DragDropPayload).DataSize = uVar5;
LAB_0018f625:
  iVar1 = pIVar2->FrameCount;
  (pIVar2->DragDropPayload).DataFrameCount = iVar1;
  return pIVar2->DragDropAcceptFrameCount == iVar1 + -1 || pIVar2->DragDropAcceptFrameCount == iVar1
  ;
}

Assistant:

bool ImGui::SetDragDropPayload(const char* type, const void* data, size_t data_size, ImGuiCond cond)
{
    ImGuiContext& g = *GImGui;
    ImGuiPayload& payload = g.DragDropPayload;
    if (cond == 0)
        cond = ImGuiCond_Always;

    IM_ASSERT(type != NULL);
    IM_ASSERT(strlen(type) < IM_ARRAYSIZE(payload.DataType) && "Payload type can be at most 32 characters long");
    IM_ASSERT((data != NULL && data_size > 0) || (data == NULL && data_size == 0));
    IM_ASSERT(cond == ImGuiCond_Always || cond == ImGuiCond_Once);
    IM_ASSERT(payload.SourceId != 0); // Not called between BeginDragDropSource() and EndDragDropSource()

    if (cond == ImGuiCond_Always || payload.DataFrameCount == -1)
    {
        // Copy payload
        ImStrncpy(payload.DataType, type, IM_ARRAYSIZE(payload.DataType));
        g.DragDropPayloadBufHeap.resize(0);
        if (data_size > sizeof(g.DragDropPayloadBufLocal))
        {
            // Store in heap
            g.DragDropPayloadBufHeap.resize((int)data_size);
            payload.Data = g.DragDropPayloadBufHeap.Data;
            memcpy(payload.Data, data, data_size);
        }
        else if (data_size > 0)
        {
            // Store locally
            memset(&g.DragDropPayloadBufLocal, 0, sizeof(g.DragDropPayloadBufLocal));
            payload.Data = g.DragDropPayloadBufLocal;
            memcpy(payload.Data, data, data_size);
        }
        else
        {
            payload.Data = NULL;
        }
        payload.DataSize = (int)data_size;
    }
    payload.DataFrameCount = g.FrameCount;

    // Return whether the payload has been accepted
    return (g.DragDropAcceptFrameCount == g.FrameCount) || (g.DragDropAcceptFrameCount == g.FrameCount - 1);
}